

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O3

void mbedtls_ssl_send_flight_completed(mbedtls_ssl_context *ssl)

{
  uchar uVar1;
  
  ssl->handshake->retransmit_timeout = ssl->conf->hs_timeout_min;
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0x207,"update timeout value to %lu millisecs");
  mbedtls_ssl_set_timer(ssl,ssl->handshake->retransmit_timeout);
  if ((ssl->in_msgtype != 0x16) || (uVar1 = '\x03', *ssl->in_msg != '\x14')) {
    uVar1 = '\x02';
  }
  ssl->handshake->retransmit_state = uVar1;
  return;
}

Assistant:

void mbedtls_ssl_send_flight_completed(mbedtls_ssl_context *ssl)
{
    ssl_reset_retransmit_timeout(ssl);
    mbedtls_ssl_set_timer(ssl, ssl->handshake->retransmit_timeout);

    if (ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE &&
        ssl->in_msg[0] == MBEDTLS_SSL_HS_FINISHED) {
        ssl->handshake->retransmit_state = MBEDTLS_SSL_RETRANS_FINISHED;
    } else {
        ssl->handshake->retransmit_state = MBEDTLS_SSL_RETRANS_WAITING;
    }
}